

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_257,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  char cVar24;
  byte bVar25;
  byte bVar26;
  size_t mask;
  ulong uVar27;
  byte bVar28;
  ushort uVar29;
  NodeRef *pNVar30;
  NodeRef root;
  size_t sVar31;
  uint uVar32;
  undefined4 uVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  bool bVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 bi_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_3;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_2;
  undefined1 auVar74 [16];
  float fVar75;
  float fVar78;
  float fVar79;
  vint4 bi_2;
  float fVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vfloat4 a0;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar38;
  int iVar51;
  int iVar52;
  int iVar53;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar44 = *(undefined1 (*) [16])(ray + 0x80);
    auVar41 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar16 = ZEXT812(0) << 0x20;
    auVar42 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(auVar44,auVar42,5);
    uVar36 = vpcmpeqd_avx512vl(auVar41,(undefined1  [16])valid_i->field_0);
    uVar36 = ((byte)uVar10 & 0xf) & uVar36;
    bVar26 = (byte)uVar36;
    if (bVar26 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar39._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar39._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar39._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar39._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar40 = vfmadd231ps_fma(auVar39,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar40 = vfmadd231ps_fma(auVar40,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar39 = vrsqrt14ps_avx512vl(auVar40);
      auVar43._8_4_ = 0xbf000000;
      auVar43._0_8_ = 0xbf000000bf000000;
      auVar43._12_4_ = 0xbf000000;
      auVar40 = vmulps_avx512vl(auVar40,auVar43);
      fVar75 = auVar39._0_4_;
      fVar78 = auVar39._4_4_;
      fVar79 = auVar39._8_4_;
      fVar80 = auVar39._12_4_;
      auVar48._0_4_ = fVar75 * fVar75 * fVar75 * auVar40._0_4_;
      auVar48._4_4_ = fVar78 * fVar78 * fVar78 * auVar40._4_4_;
      auVar48._8_4_ = fVar79 * fVar79 * fVar79 * auVar40._8_4_;
      auVar48._12_4_ = fVar80 * fVar80 * fVar80 * auVar40._12_4_;
      auVar40._8_4_ = 0x3fc00000;
      auVar40._0_8_ = 0x3fc000003fc00000;
      auVar40._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar48,auVar39,auVar40);
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      uVar27 = uVar36;
      do {
        lVar12 = 0;
        for (uVar37 = uVar27; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        uVar37 = (ulong)(uint)((int)lVar12 * 4);
        auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar37 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar37 + 0x50)),0x1c);
        fVar75 = *(float *)((long)pre.ray_space + (uVar37 - 0x10));
        auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + uVar37 + 0x60)),0x28);
        auVar81._0_4_ = auVar40._0_4_ * fVar75;
        auVar81._4_4_ = auVar40._4_4_ * fVar75;
        auVar81._8_4_ = auVar40._8_4_ * fVar75;
        auVar81._12_4_ = auVar40._12_4_ * fVar75;
        auVar43 = vshufpd_avx(auVar81,auVar81,1);
        auVar40 = vmovshdup_avx(auVar81);
        auVar87._0_4_ = auVar40._0_4_ ^ 0x80000000;
        auVar48 = vunpckhps_avx(auVar81,auVar42);
        auVar84._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
        auVar84._8_8_ = auVar43._8_8_ ^ auVar49._8_8_;
        auVar39 = vinsertps_avx(auVar84,auVar81,0x2a);
        auVar40 = vdpps_avx(auVar39,auVar39,0x7f);
        auVar87._4_12_ = auVar16;
        auVar48 = vshufps_avx(auVar48,auVar87,0x41);
        auVar43 = vdpps_avx(auVar48,auVar48,0x7f);
        uVar10 = vcmpps_avx512vl(auVar40,auVar43,1);
        auVar40 = vpmovm2d_avx512vl(uVar10);
        auVar90._0_4_ = auVar40._0_4_;
        auVar90._4_4_ = auVar90._0_4_;
        auVar90._8_4_ = auVar90._0_4_;
        auVar90._12_4_ = auVar90._0_4_;
        uVar37 = vpmovd2m_avx512vl(auVar90);
        auVar50._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar41._4_4_;
        auVar50._0_4_ = (uint)((byte)uVar37 & 1) * auVar41._0_4_;
        auVar50._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar41._8_4_;
        auVar50._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar41._12_4_;
        auVar40 = vblendvps_avx(auVar39,auVar48,auVar50);
        auVar43 = vdpps_avx(auVar40,auVar40,0x7f);
        auVar91._4_12_ = auVar16;
        auVar91._0_4_ = auVar43._0_4_;
        auVar39 = vrsqrt14ss_avx512f(auVar42,auVar91);
        fVar78 = auVar39._0_4_;
        fVar78 = fVar78 * 1.5 - auVar43._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar85._0_4_ = auVar40._0_4_ * fVar78;
        auVar85._4_4_ = auVar40._4_4_ * fVar78;
        auVar85._8_4_ = auVar40._8_4_ * fVar78;
        auVar85._12_4_ = auVar40._12_4_ * fVar78;
        auVar40 = vshufps_avx(auVar85,auVar85,0xc9);
        auVar43 = vshufps_avx(auVar81,auVar81,0xc9);
        auVar92._0_4_ = auVar85._0_4_ * auVar43._0_4_;
        auVar92._4_4_ = auVar85._4_4_ * auVar43._4_4_;
        auVar92._8_4_ = auVar85._8_4_ * auVar43._8_4_;
        auVar92._12_4_ = auVar85._12_4_ * auVar43._12_4_;
        auVar40 = vfmsub231ps_fma(auVar92,auVar81,auVar40);
        auVar43 = vshufps_avx(auVar40,auVar40,0xc9);
        auVar40 = vdpps_avx(auVar43,auVar43,0x7f);
        uVar27 = uVar27 - 1 & uVar27;
        auVar93._4_12_ = auVar16;
        auVar93._0_4_ = auVar40._0_4_;
        auVar39 = vrsqrt14ss_avx512f(auVar42,auVar93);
        fVar78 = auVar39._0_4_;
        fVar78 = fVar78 * 1.5 - auVar40._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar88._0_4_ = fVar78 * auVar43._0_4_;
        auVar88._4_4_ = fVar78 * auVar43._4_4_;
        auVar88._8_4_ = fVar78 * auVar43._8_4_;
        auVar88._12_4_ = fVar78 * auVar43._12_4_;
        auVar82._0_4_ = fVar75 * auVar81._0_4_;
        auVar82._4_4_ = fVar75 * auVar81._4_4_;
        auVar82._8_4_ = fVar75 * auVar81._8_4_;
        auVar82._12_4_ = fVar75 * auVar81._12_4_;
        auVar39 = vunpcklps_avx(auVar85,auVar82);
        auVar40 = vunpckhps_avx(auVar85,auVar82);
        auVar48 = vunpcklps_avx(auVar88,auVar42);
        auVar43 = vunpckhps_avx(auVar88,auVar42);
        aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar40,auVar43);
        aVar9 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar39,auVar48);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar39,auVar48);
        pre.ray_space[lVar12].vx.field_0 = aVar9;
        pre.ray_space[lVar12].vy.field_0 = aVar7;
        pre.ray_space[lVar12].vz.field_0 = aVar8;
      } while (uVar27 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = ZEXT1664(auVar41);
      auVar42 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar41);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar95 = ZEXT1664(auVar40);
      uVar27 = vcmpps_avx512vl(auVar42,auVar40,1);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar96 = ZEXT1664(auVar42);
      auVar43 = vdivps_avx512vl(auVar42,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar39 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar41);
      uVar37 = vcmpps_avx512vl(auVar39,auVar40,1);
      auVar39 = vdivps_avx512vl(auVar42,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar41 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar41);
      uVar11 = vcmpps_avx512vl(auVar41,auVar40,1);
      auVar41 = vdivps_avx512vl(auVar42,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar35 = (bool)((byte)uVar27 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar43._0_4_;
      bVar35 = (bool)((byte)(uVar27 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar43._4_4_;
      bVar35 = (bool)((byte)(uVar27 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar43._8_4_;
      bVar35 = (bool)((byte)(uVar27 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar43._12_4_;
      bVar35 = (bool)((byte)uVar37 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar39._0_4_;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar39._4_4_;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar39._8_4_;
      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar39._12_4_;
      bVar35 = (bool)((byte)uVar11 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar41._0_4_;
      bVar35 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar41._4_4_;
      bVar35 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar41._8_4_;
      bVar35 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar35 * 0x5d5e0b6b | (uint)!bVar35 * auVar41._12_4_;
      auVar42 = ZEXT816(0);
      uVar27 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar42,1);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar41._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar27 & 1) * auVar41._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar41._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar41._12_4_;
      uVar27 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar42,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar35 = (bool)((byte)uVar27 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar35 * auVar41._0_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar27 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar27 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar27 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * 0x60;
      uVar27 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar42,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar35 = (bool)((byte)uVar27 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar35 * auVar41._0_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar27 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar27 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar27 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar98 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar42);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar26 & 1) * auVar41._0_4_ |
           (uint)!(bool)(bVar26 & 1) * stack_near[0].field_0._0_4_;
      bVar35 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar35 * auVar41._4_4_ | (uint)!bVar35 * stack_near[0].field_0._4_4_;
      bVar35 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar35 * auVar41._8_4_ | (uint)!bVar35 * stack_near[0].field_0._8_4_;
      bVar35 = SUB81(uVar36 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar35 * auVar41._12_4_ | (uint)!bVar35 * stack_near[0].field_0._12_4_;
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar97 = ZEXT1664(auVar41);
      auVar44 = vmaxps_avx512vl(auVar44,auVar42);
      tray.tfar.field_0.i[0] =
           (uint)(bVar26 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar41._0_4_;
      bVar35 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar35 * auVar44._4_4_ | (uint)!bVar35 * auVar41._4_4_;
      bVar35 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar35 * auVar44._8_4_ | (uint)!bVar35 * auVar41._8_4_;
      bVar35 = SUB81(uVar36 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar35 * auVar44._12_4_ | (uint)!bVar35 * auVar41._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      uVar29 = (ushort)uVar36 ^ 0xf;
      pNVar30 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar99 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar100 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = ZEXT1664(auVar44);
      do {
        paVar34 = paVar34 + -1;
        root.ptr = pNVar30[-1].ptr;
        pNVar30 = pNVar30 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00823975:
          iVar38 = 3;
        }
        else {
          aVar1 = *paVar34;
          uVar36 = vcmpps_avx512vl((undefined1  [16])aVar1,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar36 == '\0') {
LAB_00823979:
            iVar38 = 2;
          }
          else {
            uVar33 = (undefined4)uVar36;
            iVar38 = 0;
            if ((uint)POPCOUNT(uVar33) <= uVar32) {
              do {
                sVar31 = 0;
                for (uVar27 = uVar36; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
                {
                  sVar31 = sVar31 + 1;
                }
                bVar35 = occluded1(This,bvh,root,sVar31,&pre,ray,&tray,context);
                bVar23 = (byte)(1 << ((uint)sVar31 & 0x1f));
                if (!bVar35) {
                  bVar23 = 0;
                }
                bVar23 = (byte)uVar29 | bVar23;
                uVar29 = (ushort)bVar23;
                uVar36 = uVar36 - 1 & uVar36;
              } while (uVar36 != 0);
              if (bVar23 == 0xf) {
                iVar38 = 3;
              }
              else {
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar23 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(bVar23 & 1) * tray.tfar.field_0.i[0];
                bVar35 = (bool)(bVar23 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar35 * auVar44._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
                bVar35 = (bool)(bVar23 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar35 * auVar44._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
                bVar35 = (bool)(bVar23 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar35 * auVar44._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
                iVar38 = 2;
              }
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar94 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar95 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar96 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar97 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar98 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar99 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar100 = ZEXT1664(auVar44);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar101 = ZEXT1664(auVar44);
            }
            auVar102 = ZEXT1664((undefined1  [16])aVar1);
            if (uVar32 < (uint)POPCOUNT(uVar33)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00823975;
                  uVar10 = vcmpps_avx512vl(auVar102._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar10 != '\0') {
                    bVar23 = (byte)uVar29 & 0xf;
                    if (bVar23 == 0xf) {
                      bVar25 = 0;
                    }
                    else {
                      uVar36 = (ulong)(bVar23 ^ 0xf);
                      bVar23 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      bVar25 = 0;
                      do {
                        lVar12 = 0;
                        for (uVar27 = uVar36; (uVar27 & 1) == 0;
                            uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                          lVar12 = lVar12 + 1;
                        }
                        cVar24 = (**(code **)((long)pvVar3 + (ulong)bVar23 * 0x40 + 0x18))
                                           (&pre,ray,lVar12,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        bVar28 = (byte)(1 << ((uint)lVar12 & 0x1f));
                        if (cVar24 == '\0') {
                          bVar28 = 0;
                        }
                        bVar25 = bVar25 | bVar28;
                        uVar36 = uVar36 - 1 & uVar36;
                      } while (uVar36 != 0);
                    }
                    bVar25 = (byte)uVar29 | bVar25;
                    uVar29 = (ushort)bVar25;
                    if (bVar25 == 0xf) {
                      iVar38 = 3;
                    }
                    else {
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      tray.tfar.field_0.i[0] =
                           (uint)(bVar25 & 1) * auVar44._0_4_ |
                           (uint)!(bool)(bVar25 & 1) * tray.tfar.field_0.i[0];
                      bVar35 = (bool)(bVar25 >> 1 & 1);
                      tray.tfar.field_0.i[1] =
                           (uint)bVar35 * auVar44._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
                      bVar35 = (bool)(bVar25 >> 2 & 1);
                      tray.tfar.field_0.i[2] =
                           (uint)bVar35 * auVar44._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
                      bVar35 = (bool)(bVar25 >> 3 & 1);
                      tray.tfar.field_0.i[3] =
                           (uint)bVar35 * auVar44._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
                      iVar38 = 0;
                    }
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar94 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar95 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar96 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar97 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar98 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar99 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar100 = ZEXT1664(auVar44);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar101 = ZEXT1664(auVar44);
                    break;
                  }
                  goto LAB_00823979;
                }
                uVar27 = root.ptr & 0xfffffffffffffff0;
                auVar102 = ZEXT1664(auVar98._0_16_);
                uVar36 = 0;
                sVar31 = 8;
                do {
                  sVar2 = *(size_t *)(uVar27 + uVar36 * 8);
                  if (sVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar33 = *(undefined4 *)(root.ptr + 0x40 + uVar36 * 4);
                      auVar54._4_4_ = uVar33;
                      auVar54._0_4_ = uVar33;
                      auVar54._8_4_ = uVar33;
                      auVar54._12_4_ = uVar33;
                      auVar17._8_8_ = tray.org.field_0._8_8_;
                      auVar17._0_8_ = tray.org.field_0._0_8_;
                      auVar19._8_8_ = tray.org.field_0._24_8_;
                      auVar19._0_8_ = tray.org.field_0._16_8_;
                      auVar21._8_8_ = tray.org.field_0._40_8_;
                      auVar21._0_8_ = tray.org.field_0._32_8_;
                      auVar44 = vsubps_avx(auVar54,auVar17);
                      auVar71._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar44._0_4_;
                      auVar71._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar44._4_4_;
                      auVar71._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar44._8_4_;
                      auVar71._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar44._12_4_;
                      uVar33 = *(undefined4 *)(root.ptr + 0x80 + uVar36 * 4);
                      auVar55._4_4_ = uVar33;
                      auVar55._0_4_ = uVar33;
                      auVar55._8_4_ = uVar33;
                      auVar55._12_4_ = uVar33;
                      auVar44 = vsubps_avx(auVar55,auVar19);
                      auVar76._0_4_ = tray.rdir.field_0._16_4_ * auVar44._0_4_;
                      auVar76._4_4_ = tray.rdir.field_0._20_4_ * auVar44._4_4_;
                      auVar76._8_4_ = tray.rdir.field_0._24_4_ * auVar44._8_4_;
                      auVar76._12_4_ = tray.rdir.field_0._28_4_ * auVar44._12_4_;
                      uVar33 = *(undefined4 *)(root.ptr + 0xc0 + uVar36 * 4);
                      auVar56._4_4_ = uVar33;
                      auVar56._0_4_ = uVar33;
                      auVar56._8_4_ = uVar33;
                      auVar56._12_4_ = uVar33;
                      auVar44 = vsubps_avx(auVar56,auVar21);
                      auVar83._0_4_ = tray.rdir.field_0._32_4_ * auVar44._0_4_;
                      auVar83._4_4_ = tray.rdir.field_0._36_4_ * auVar44._4_4_;
                      auVar83._8_4_ = tray.rdir.field_0._40_4_ * auVar44._8_4_;
                      auVar83._12_4_ = tray.rdir.field_0._44_4_ * auVar44._12_4_;
                      uVar33 = *(undefined4 *)(root.ptr + 0x60 + uVar36 * 4);
                      auVar57._4_4_ = uVar33;
                      auVar57._0_4_ = uVar33;
                      auVar57._8_4_ = uVar33;
                      auVar57._12_4_ = uVar33;
                      auVar44 = vsubps_avx(auVar57,auVar17);
                      uVar33 = *(undefined4 *)(root.ptr + 0xa0 + uVar36 * 4);
                      auVar61._4_4_ = uVar33;
                      auVar61._0_4_ = uVar33;
                      auVar61._8_4_ = uVar33;
                      auVar61._12_4_ = uVar33;
                      auVar69._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar44._0_4_;
                      auVar69._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar44._4_4_;
                      auVar69._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar44._8_4_;
                      auVar69._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar44._12_4_;
                      auVar44 = vsubps_avx(auVar61,auVar19);
                      auVar62._0_4_ = tray.rdir.field_0._16_4_ * auVar44._0_4_;
                      auVar62._4_4_ = tray.rdir.field_0._20_4_ * auVar44._4_4_;
                      auVar62._8_4_ = tray.rdir.field_0._24_4_ * auVar44._8_4_;
                      auVar62._12_4_ = tray.rdir.field_0._28_4_ * auVar44._12_4_;
                      uVar33 = *(undefined4 *)(root.ptr + 0xe0 + uVar36 * 4);
                      auVar58._4_4_ = uVar33;
                      auVar58._0_4_ = uVar33;
                      auVar58._8_4_ = uVar33;
                      auVar58._12_4_ = uVar33;
                      auVar44 = vsubps_avx(auVar58,auVar21);
                      auVar64._0_4_ = tray.rdir.field_0._32_4_ * auVar44._0_4_;
                      auVar64._4_4_ = tray.rdir.field_0._36_4_ * auVar44._4_4_;
                      auVar64._8_4_ = tray.rdir.field_0._40_4_ * auVar44._8_4_;
                      auVar64._12_4_ = tray.rdir.field_0._44_4_ * auVar44._12_4_;
                      auVar44 = vminps_avx(auVar71,auVar69);
                      auVar41 = vminps_avx(auVar76,auVar62);
                      auVar44 = vmaxps_avx(auVar44,auVar41);
                      auVar41 = vminps_avx(auVar83,auVar64);
                      auVar44 = vmaxps_avx(auVar44,auVar41);
                      auVar42 = vmulps_avx512vl(auVar44,auVar99._0_16_);
                      auVar44 = vmaxps_avx(auVar71,auVar69);
                      auVar41 = vmaxps_avx(auVar76,auVar62);
                      auVar41 = vminps_avx(auVar44,auVar41);
                      auVar44 = vmaxps_avx(auVar83,auVar64);
                      auVar44 = vminps_avx(auVar41,auVar44);
                      auVar41 = vmulps_avx512vl(auVar44,auVar100._0_16_);
                      auVar44 = vmaxps_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                      auVar41 = vminps_avx(auVar41,(undefined1  [16])tray.tfar.field_0);
                    }
                    else {
                      uVar33 = *(undefined4 *)(uVar27 + 0x40 + uVar36 * 4);
                      auVar65._4_4_ = uVar33;
                      auVar65._0_4_ = uVar33;
                      auVar65._8_4_ = uVar33;
                      auVar65._12_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar27 + 0x60 + uVar36 * 4);
                      auVar63._4_4_ = uVar33;
                      auVar63._0_4_ = uVar33;
                      auVar63._8_4_ = uVar33;
                      auVar63._12_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar27 + 0x80 + uVar36 * 4);
                      auVar59._4_4_ = uVar33;
                      auVar59._0_4_ = uVar33;
                      auVar59._8_4_ = uVar33;
                      auVar59._12_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar27 + 0xa0 + uVar36 * 4);
                      auVar89._4_4_ = uVar33;
                      auVar89._0_4_ = uVar33;
                      auVar89._8_4_ = uVar33;
                      auVar89._12_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar27 + 0xc0 + uVar36 * 4);
                      auVar86._4_4_ = uVar33;
                      auVar86._0_4_ = uVar33;
                      auVar86._8_4_ = uVar33;
                      auVar86._12_4_ = uVar33;
                      uVar33 = *(undefined4 *)(uVar27 + 0xe0 + uVar36 * 4);
                      auVar77._4_4_ = uVar33;
                      auVar77._0_4_ = uVar33;
                      auVar77._8_4_ = uVar33;
                      auVar77._12_4_ = uVar33;
                      fVar75 = *(float *)(uVar27 + 0x100 + uVar36 * 4);
                      auVar74._4_4_ = fVar75;
                      auVar74._0_4_ = fVar75;
                      auVar74._8_4_ = fVar75;
                      auVar74._12_4_ = fVar75;
                      fVar78 = *(float *)(uVar27 + 0x120 + uVar36 * 4);
                      auVar72._4_4_ = fVar78;
                      auVar72._0_4_ = fVar78;
                      auVar72._8_4_ = fVar78;
                      auVar72._12_4_ = fVar78;
                      fVar79 = *(float *)(uVar27 + 0x140 + uVar36 * 4);
                      auVar67._4_4_ = fVar79;
                      auVar67._0_4_ = fVar79;
                      auVar67._8_4_ = fVar79;
                      auVar67._12_4_ = fVar79;
                      auVar18._8_8_ = tray.org.field_0._8_8_;
                      auVar18._0_8_ = tray.org.field_0._0_8_;
                      auVar20._8_8_ = tray.org.field_0._24_8_;
                      auVar20._0_8_ = tray.org.field_0._16_8_;
                      auVar22._8_8_ = tray.org.field_0._40_8_;
                      auVar22._0_8_ = tray.org.field_0._32_8_;
                      auVar44._0_4_ = (float)tray.dir.field_0._32_4_ * fVar75;
                      auVar44._4_4_ = (float)tray.dir.field_0._36_4_ * fVar75;
                      auVar44._8_4_ = (float)tray.dir.field_0._40_4_ * fVar75;
                      auVar44._12_4_ = (float)tray.dir.field_0._44_4_ * fVar75;
                      auVar41._0_4_ = (float)tray.dir.field_0._32_4_ * fVar78;
                      auVar41._4_4_ = (float)tray.dir.field_0._36_4_ * fVar78;
                      auVar41._8_4_ = (float)tray.dir.field_0._40_4_ * fVar78;
                      auVar41._12_4_ = (float)tray.dir.field_0._44_4_ * fVar78;
                      auVar42._0_4_ = (float)tray.dir.field_0._32_4_ * fVar79;
                      auVar42._4_4_ = (float)tray.dir.field_0._36_4_ * fVar79;
                      auVar42._8_4_ = (float)tray.dir.field_0._40_4_ * fVar79;
                      auVar42._12_4_ = (float)tray.dir.field_0._44_4_ * fVar79;
                      auVar44 = vfmadd231ps_avx512vl
                                          (auVar44,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar89);
                      auVar41 = vfmadd231ps_avx512vl
                                          (auVar41,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar86);
                      auVar42 = vfmadd231ps_avx512vl
                                          (auVar42,auVar77,
                                           (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                      auVar44 = vfmadd231ps_fma(auVar44,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar65);
                      auVar41 = vfmadd231ps_fma(auVar41,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar63);
                      auVar42 = vfmadd231ps_fma(auVar42,auVar59,
                                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0
                                               );
                      auVar43 = auVar94._0_16_;
                      auVar40 = vandps_avx512vl(auVar44,auVar43);
                      auVar39 = auVar95._0_16_;
                      uVar37 = vcmpps_avx512vl(auVar40,auVar39,1);
                      bVar35 = (bool)((byte)uVar37 & 1);
                      iVar38 = auVar95._0_4_;
                      auVar45._0_4_ = (uint)bVar35 * iVar38 | (uint)!bVar35 * auVar44._0_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
                      iVar51 = auVar95._4_4_;
                      auVar45._4_4_ = (uint)bVar35 * iVar51 | (uint)!bVar35 * auVar44._4_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
                      iVar52 = auVar95._8_4_;
                      iVar53 = auVar95._12_4_;
                      auVar45._8_4_ = (uint)bVar35 * iVar52 | (uint)!bVar35 * auVar44._8_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
                      auVar45._12_4_ = (uint)bVar35 * iVar53 | (uint)!bVar35 * auVar44._12_4_;
                      auVar44 = vandps_avx512vl(auVar41,auVar43);
                      uVar37 = vcmpps_avx512vl(auVar44,auVar39,1);
                      bVar35 = (bool)((byte)uVar37 & 1);
                      auVar46._0_4_ = (uint)bVar35 * iVar38 | (uint)!bVar35 * auVar41._0_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
                      auVar46._4_4_ = (uint)bVar35 * iVar51 | (uint)!bVar35 * auVar41._4_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
                      auVar46._8_4_ = (uint)bVar35 * iVar52 | (uint)!bVar35 * auVar41._8_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
                      auVar46._12_4_ = (uint)bVar35 * iVar53 | (uint)!bVar35 * auVar41._12_4_;
                      auVar44 = vandps_avx512vl(auVar42,auVar43);
                      uVar37 = vcmpps_avx512vl(auVar44,auVar39,1);
                      bVar35 = (bool)((byte)uVar37 & 1);
                      auVar47._0_4_ = (uint)bVar35 * iVar38 | (uint)!bVar35 * auVar42._0_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
                      auVar47._4_4_ = (uint)bVar35 * iVar51 | (uint)!bVar35 * auVar42._4_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
                      auVar47._8_4_ = (uint)bVar35 * iVar52 | (uint)!bVar35 * auVar42._8_4_;
                      bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
                      auVar47._12_4_ = (uint)bVar35 * iVar53 | (uint)!bVar35 * auVar42._12_4_;
                      auVar44 = vrcp14ps_avx512vl(auVar45);
                      auVar40 = auVar96._0_16_;
                      auVar41 = vfnmadd213ps_avx512vl(auVar45,auVar44,auVar40);
                      auVar44 = vfmadd132ps_fma(auVar41,auVar44,auVar44);
                      auVar41 = vrcp14ps_avx512vl(auVar46);
                      auVar42 = vfnmadd213ps_avx512vl(auVar46,auVar41,auVar40);
                      auVar41 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
                      auVar42 = vrcp14ps_avx512vl(auVar47);
                      auVar40 = vfnmadd213ps_avx512vl(auVar47,auVar42,auVar40);
                      auVar42 = vfmadd132ps_fma(auVar40,auVar42,auVar42);
                      auVar50 = auVar101._0_16_;
                      auVar48 = vxorps_avx512vl(auVar44,auVar50);
                      auVar49 = vxorps_avx512vl(auVar41,auVar50);
                      uVar33 = *(undefined4 *)(uVar27 + 0x160 + uVar36 * 4);
                      auVar13._4_4_ = uVar33;
                      auVar13._0_4_ = uVar33;
                      auVar13._8_4_ = uVar33;
                      auVar13._12_4_ = uVar33;
                      auVar40 = vfmadd213ps_avx512vl(auVar74,auVar22,auVar13);
                      uVar33 = *(undefined4 *)(uVar27 + 0x180 + uVar36 * 4);
                      auVar14._4_4_ = uVar33;
                      auVar14._0_4_ = uVar33;
                      auVar14._8_4_ = uVar33;
                      auVar14._12_4_ = uVar33;
                      auVar43 = vfmadd213ps_avx512vl(auVar72,auVar22,auVar14);
                      uVar33 = *(undefined4 *)(uVar27 + 0x1a0 + uVar36 * 4);
                      auVar15._4_4_ = uVar33;
                      auVar15._0_4_ = uVar33;
                      auVar15._8_4_ = uVar33;
                      auVar15._12_4_ = uVar33;
                      auVar39 = vfmadd213ps_avx512vl(auVar67,auVar22,auVar15);
                      auVar50 = vxorps_avx512vl(auVar42,auVar50);
                      auVar40 = vfmadd231ps_fma(auVar40,auVar20,auVar89);
                      auVar43 = vfmadd231ps_fma(auVar43,auVar20,auVar86);
                      auVar39 = vfmadd231ps_fma(auVar39,auVar20,auVar77);
                      auVar40 = vfmadd231ps_fma(auVar40,auVar18,auVar65);
                      auVar66._0_4_ = auVar48._0_4_ * auVar40._0_4_;
                      auVar66._4_4_ = auVar48._4_4_ * auVar40._4_4_;
                      auVar66._8_4_ = auVar48._8_4_ * auVar40._8_4_;
                      auVar66._12_4_ = auVar48._12_4_ * auVar40._12_4_;
                      auVar40 = vfmadd231ps_fma(auVar43,auVar18,auVar63);
                      auVar43 = vmulps_avx512vl(auVar40,auVar49);
                      auVar40 = vfmadd231ps_fma(auVar39,auVar18,auVar59);
                      auVar60._0_4_ = auVar50._0_4_ * auVar40._0_4_;
                      auVar60._4_4_ = auVar50._4_4_ * auVar40._4_4_;
                      auVar60._8_4_ = auVar50._8_4_ * auVar40._8_4_;
                      auVar60._12_4_ = auVar50._12_4_ * auVar40._12_4_;
                      auVar68._0_4_ = auVar44._0_4_ + auVar66._0_4_;
                      auVar68._4_4_ = auVar44._4_4_ + auVar66._4_4_;
                      auVar68._8_4_ = auVar44._8_4_ + auVar66._8_4_;
                      auVar68._12_4_ = auVar44._12_4_ + auVar66._12_4_;
                      auVar70._0_4_ = auVar41._0_4_ + auVar43._0_4_;
                      auVar70._4_4_ = auVar41._4_4_ + auVar43._4_4_;
                      auVar70._8_4_ = auVar41._8_4_ + auVar43._8_4_;
                      auVar70._12_4_ = auVar41._12_4_ + auVar43._12_4_;
                      auVar73._0_4_ = auVar42._0_4_ + auVar60._0_4_;
                      auVar73._4_4_ = auVar42._4_4_ + auVar60._4_4_;
                      auVar73._8_4_ = auVar42._8_4_ + auVar60._8_4_;
                      auVar73._12_4_ = auVar42._12_4_ + auVar60._12_4_;
                      auVar44 = vpminsd_avx(auVar66,auVar68);
                      auVar41 = vpminsd_avx(auVar43,auVar70);
                      auVar44 = vpmaxsd_avx(auVar44,auVar41);
                      auVar41 = vpminsd_avx(auVar60,auVar73);
                      auVar44 = vpmaxsd_avx(auVar44,auVar41);
                      auVar41 = vpmaxsd_avx(auVar66,auVar68);
                      auVar42 = vpmaxsd_avx(auVar43,auVar70);
                      auVar42 = vpminsd_avx(auVar41,auVar42);
                      auVar41 = vpmaxsd_avx(auVar60,auVar73);
                      auVar41 = vpminsd_avx(auVar42,auVar41);
                      auVar42 = vmulps_avx512vl(auVar44,auVar99._0_16_);
                      auVar41 = vmulps_avx512vl(auVar41,auVar100._0_16_);
                      auVar44 = vpmaxsd_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                      auVar41 = vpminsd_avx(auVar41,(undefined1  [16])tray.tfar.field_0);
                    }
                    uVar37 = vcmpps_avx512vl(auVar44,auVar41,2);
                    if ((uVar37 & 0xf) != 0) {
                      auVar44 = vblendmps_avx512vl(auVar98._0_16_,auVar42);
                      bVar35 = (bool)((byte)uVar37 & 1);
                      bVar4 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar6 = (bool)((byte)(uVar37 >> 3) & 1);
                      if (sVar31 != 8) {
                        pNVar30->ptr = sVar31;
                        pNVar30 = pNVar30 + 1;
                        *paVar34 = auVar102._0_16_;
                        paVar34 = paVar34 + 1;
                      }
                      auVar102 = ZEXT1664(CONCAT412((uint)bVar6 * auVar44._12_4_ |
                                                    (uint)!bVar6 * auVar42._12_4_,
                                                    CONCAT48((uint)bVar5 * auVar44._8_4_ |
                                                             (uint)!bVar5 * auVar42._8_4_,
                                                             CONCAT44((uint)bVar4 * auVar44._4_4_ |
                                                                      (uint)!bVar4 * auVar42._4_4_,
                                                                      (uint)bVar35 * auVar44._0_4_ |
                                                                      (uint)!bVar35 * auVar42._0_4_)
                                                            )));
                      sVar31 = sVar2;
                    }
                  }
                } while ((sVar2 != 8) && (bVar35 = uVar36 < 7, uVar36 = uVar36 + 1, bVar35));
                iVar38 = 0;
                if (sVar31 == 8) {
LAB_00823817:
                  bVar35 = false;
                  iVar38 = 4;
                }
                else {
                  uVar10 = vcmpps_avx512vl((undefined1  [16])auVar102._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar35 = true;
                  if ((uint)POPCOUNT((int)uVar10) <= uVar32) {
                    pNVar30->ptr = sVar31;
                    pNVar30 = pNVar30 + 1;
                    *paVar34 = auVar102._0_16_;
                    paVar34 = paVar34 + 1;
                    goto LAB_00823817;
                  }
                }
                root.ptr = sVar31;
              } while (bVar35);
            }
          }
        }
      } while (iVar38 != 3);
      bVar26 = (byte)uVar29 & bVar26;
      bVar35 = (bool)(bVar26 >> 1 & 1);
      bVar4 = (bool)(bVar26 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar26 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar26 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar35 * auVar97._4_4_ | (uint)!bVar35 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar4 * auVar97._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar26 >> 3) * auVar97._12_4_ | (uint)!(bool)(bVar26 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }